

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ternary_executor.hpp
# Opt level: O1

idx_t duckdb::TernaryExecutor::
      SelectLoopSelSwitch<float,float,float,duckdb::BothInclusiveBetweenOperator,false>
                (UnifiedVectorFormat *adata,UnifiedVectorFormat *bdata,UnifiedVectorFormat *cdata,
                SelectionVector *sel,idx_t count,SelectionVector *true_sel,
                SelectionVector *false_sel)

{
  SelectionVector *asel;
  unsigned_long *puVar1;
  bool bVar2;
  idx_t iVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ValidityMask *bvalidity;
  ValidityMask *cvalidity;
  SelectionVector *bsel;
  long lVar8;
  ulong uVar9;
  ValidityMask *avalidity;
  SelectionVector *csel;
  float local_8c;
  float local_88;
  float local_84;
  ValidityMask *local_80;
  float *local_78;
  float *local_70;
  float *local_68;
  SelectionVector *local_60;
  SelectionVector *local_58;
  ulong local_50;
  ValidityMask *local_48;
  SelectionVector *local_40;
  SelectionVector *local_38;
  
  asel = adata->sel;
  local_68 = (float *)adata->data;
  bsel = bdata->sel;
  local_70 = (float *)bdata->data;
  csel = cdata->sel;
  local_78 = (float *)cdata->data;
  avalidity = &adata->validity;
  bvalidity = &bdata->validity;
  cvalidity = &cdata->validity;
  if (false_sel == (SelectionVector *)0x0 || true_sel == (SelectionVector *)0x0) {
    local_80 = bvalidity;
    local_60 = csel;
    local_58 = bsel;
    local_50 = count;
    local_48 = cvalidity;
    local_40 = sel;
    if (true_sel == (SelectionVector *)0x0) {
      if (count == 0) {
        lVar8 = 0;
      }
      else {
        lVar8 = 0;
        uVar7 = 0;
        do {
          uVar9 = uVar7;
          if (local_40->sel_vector != (sel_t *)0x0) {
            uVar9 = (ulong)local_40->sel_vector[uVar7];
          }
          uVar5 = uVar7;
          if (asel->sel_vector != (sel_t *)0x0) {
            uVar5 = (ulong)asel->sel_vector[uVar7];
          }
          uVar4 = uVar7;
          if (bsel->sel_vector != (sel_t *)0x0) {
            uVar4 = (ulong)bsel->sel_vector[uVar7];
          }
          uVar6 = uVar7;
          if (csel->sel_vector != (sel_t *)0x0) {
            uVar6 = (ulong)csel->sel_vector[uVar7];
          }
          puVar1 = (avalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask;
          if ((((puVar1 == (unsigned_long *)0x0) ||
               ((puVar1[uVar5 >> 6] >> (uVar5 & 0x3f) & 1) != 0)) &&
              ((puVar1 = (bvalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask,
               puVar1 == (unsigned_long *)0x0 || ((puVar1[uVar4 >> 6] >> (uVar4 & 0x3f) & 1) != 0)))
              ) && ((puVar1 = (cvalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask,
                    puVar1 == (unsigned_long *)0x0 ||
                    ((puVar1[uVar6 >> 6] >> (uVar6 & 0x3f) & 1) != 0)))) {
            local_8c = local_68[uVar5];
            local_84 = local_70[uVar4];
            local_88 = local_78[uVar6];
            bVar2 = GreaterThanEquals::Operation<float>(&local_8c,&local_84);
            uVar5 = 1;
            count = local_50;
            bvalidity = local_80;
            cvalidity = local_48;
            bsel = local_58;
            csel = local_60;
            if (bVar2) {
              bVar2 = GreaterThan::Operation<float>(&local_8c,&local_88);
              uVar5 = (ulong)bVar2;
              count = local_50;
              bvalidity = local_80;
              cvalidity = local_48;
              bsel = local_58;
              csel = local_60;
            }
          }
          else {
            uVar5 = 1;
          }
          false_sel->sel_vector[lVar8] = (sel_t)uVar9;
          lVar8 = lVar8 + uVar5;
          uVar7 = uVar7 + 1;
        } while (count != uVar7);
      }
      iVar3 = count - lVar8;
    }
    else if (count == 0) {
      iVar3 = 0;
    }
    else {
      iVar3 = 0;
      uVar7 = 0;
      local_38 = asel;
      do {
        uVar9 = uVar7;
        if (local_40->sel_vector != (sel_t *)0x0) {
          uVar9 = (ulong)local_40->sel_vector[uVar7];
        }
        uVar5 = uVar7;
        if (local_38->sel_vector != (sel_t *)0x0) {
          uVar5 = (ulong)local_38->sel_vector[uVar7];
        }
        uVar4 = uVar7;
        if (bsel->sel_vector != (sel_t *)0x0) {
          uVar4 = (ulong)bsel->sel_vector[uVar7];
        }
        uVar6 = uVar7;
        if (csel->sel_vector != (sel_t *)0x0) {
          uVar6 = (ulong)csel->sel_vector[uVar7];
        }
        puVar1 = (avalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask;
        if ((((puVar1 == (unsigned_long *)0x0) || ((puVar1[uVar5 >> 6] >> (uVar5 & 0x3f) & 1) != 0))
            && ((puVar1 = (bvalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask,
                puVar1 == (unsigned_long *)0x0 || ((puVar1[uVar4 >> 6] >> (uVar4 & 0x3f) & 1) != 0))
               )) && ((puVar1 = (cvalidity->super_TemplatedValidityMask<unsigned_long>).
                                validity_mask, puVar1 == (unsigned_long *)0x0 ||
                      ((puVar1[uVar6 >> 6] >> (uVar6 & 0x3f) & 1) != 0)))) {
          local_8c = local_68[uVar5];
          local_84 = local_70[uVar4];
          local_88 = local_78[uVar6];
          bVar2 = GreaterThanEquals::Operation<float>(&local_8c,&local_84);
          if (bVar2) {
            bVar2 = GreaterThan::Operation<float>(&local_8c,&local_88);
            uVar5 = (ulong)!bVar2;
            count = local_50;
            bvalidity = local_80;
            cvalidity = local_48;
            bsel = local_58;
            csel = local_60;
          }
          else {
            uVar5 = 0;
            count = local_50;
            bvalidity = local_80;
            cvalidity = local_48;
            bsel = local_58;
            csel = local_60;
          }
        }
        else {
          uVar5 = 0;
        }
        true_sel->sel_vector[iVar3] = (sel_t)uVar9;
        iVar3 = iVar3 + uVar5;
        uVar7 = uVar7 + 1;
      } while (count != uVar7);
    }
  }
  else {
    iVar3 = SelectLoop<float,float,float,duckdb::BothInclusiveBetweenOperator,false,true,true>
                      (local_68,local_70,local_78,sel,count,asel,bsel,csel,avalidity,bvalidity,
                       cvalidity,true_sel,false_sel);
  }
  return iVar3;
}

Assistant:

static inline idx_t SelectLoopSelSwitch(UnifiedVectorFormat &adata, UnifiedVectorFormat &bdata,
	                                        UnifiedVectorFormat &cdata, const SelectionVector *sel, idx_t count,
	                                        SelectionVector *true_sel, SelectionVector *false_sel) {
		if (true_sel && false_sel) {
			return SelectLoop<A_TYPE, B_TYPE, C_TYPE, OP, NO_NULL, true, true>(
			    UnifiedVectorFormat::GetData<A_TYPE>(adata), UnifiedVectorFormat::GetData<B_TYPE>(bdata),
			    UnifiedVectorFormat::GetData<C_TYPE>(cdata), sel, count, *adata.sel, *bdata.sel, *cdata.sel,
			    adata.validity, bdata.validity, cdata.validity, true_sel, false_sel);
		} else if (true_sel) {
			return SelectLoop<A_TYPE, B_TYPE, C_TYPE, OP, NO_NULL, true, false>(
			    UnifiedVectorFormat::GetData<A_TYPE>(adata), UnifiedVectorFormat::GetData<B_TYPE>(bdata),
			    UnifiedVectorFormat::GetData<C_TYPE>(cdata), sel, count, *adata.sel, *bdata.sel, *cdata.sel,
			    adata.validity, bdata.validity, cdata.validity, true_sel, false_sel);
		} else {
			D_ASSERT(false_sel);
			return SelectLoop<A_TYPE, B_TYPE, C_TYPE, OP, NO_NULL, false, true>(
			    UnifiedVectorFormat::GetData<A_TYPE>(adata), UnifiedVectorFormat::GetData<B_TYPE>(bdata),
			    UnifiedVectorFormat::GetData<C_TYPE>(cdata), sel, count, *adata.sel, *bdata.sel, *cdata.sel,
			    adata.validity, bdata.validity, cdata.validity, true_sel, false_sel);
		}
	}